

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  ggml_ftype ftype;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  string fname_out;
  string fname_inp;
  allocator<char> local_7d;
  float local_7c;
  string local_78;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  if (argc == 4) {
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    uVar2 = ggml_init();
    ggml_free(uVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,argv[1],(allocator<char> *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,argv[2],&local_7d);
    ftype = ggml_parse_ftype(argv[3]);
    lVar3 = ggml_time_us();
    lVar4 = ggml_time_us();
    bVar1 = gptj_model_quantize(&local_58,&local_78,ftype);
    if (!bVar1) {
      main_cold_2();
      local_7c = 0.0;
    }
    else {
      lVar5 = ggml_time_us();
      local_7c = (float)(lVar5 - lVar4);
    }
    uVar6 = (uint)!bVar1;
    if (bVar1) {
      lVar4 = ggml_time_us();
      putchar(10);
      printf("%s: quantize time = %8.2f ms\n",SUB84((double)(local_7c / 1000.0),0),"main");
      printf("%s:    total time = %8.2f ms\n",SUB84((double)((float)(lVar4 - lVar3) / 1000.0),0),
             "main");
      uVar6 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    main_cold_1();
    uVar6 = 1;
  }
  return uVar6;
}

Assistant:

int main(int argc, char ** argv) {
    if (argc != 4) {
        fprintf(stderr, "usage: %s model-f32.bin model-quant.bin type\n", argv[0]);
        ggml_print_ftypes(stderr);
        return 1;
    }

    // needed to initialize f16 tables
    {
        struct ggml_init_params params = { 0, NULL, false };
        struct ggml_context * ctx = ggml_init(params);
        ggml_free(ctx);
    }

    const std::string fname_inp = argv[1];
    const std::string fname_out = argv[2];

    const ggml_ftype ftype = ggml_parse_ftype(argv[3]);

    const int64_t t_main_start_us = ggml_time_us();

    int64_t t_quantize_us = 0;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gptj_model_quantize(fname_inp, fname_out, ggml_ftype(ftype))) {
            fprintf(stderr, "%s: failed to quantize model from '%s'\n", __func__, fname_inp.c_str());
            return 1;
        }

        t_quantize_us = ggml_time_us() - t_start_us;
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n");
        printf("%s: quantize time = %8.2f ms\n", __func__, t_quantize_us/1000.0f);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    return 0;
}